

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop~.c
# Opt level: O1

void * loop_new(void)

{
  t_object *owner;
  t_symbol *ptVar1;
  
  owner = (t_object *)pd_new(loop_class);
  owner[1].te_binbuf = (_binbuf *)0x3f8000003f800000;
  owner[1].te_g.g_next = (_gobj *)0x0;
  inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
  ptVar1 = gensym("signal");
  outlet_new(owner,ptVar1);
  ptVar1 = gensym("signal");
  outlet_new(owner,ptVar1);
  return owner;
}

Assistant:

static void *loop_new(void)
{
    t_loop *x = (t_loop *)pd_new(loop_class);
    loopctl_init(&x->x_loopctl);
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
    outlet_new(&x->x_obj, gensym("signal"));
    outlet_new(&x->x_obj, gensym("signal"));
    return (x);
}